

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O3

DdTlcInfo * computeClausesWithUniverse(DdTlcInfo *Cres,DdHalfWord label,short phase)

{
  ulong uVar1;
  long lVar2;
  DdTlcInfo *t;
  long lVar3;
  DdHalfWord *__ptr;
  long *plVar4;
  byte bVar5;
  short in_CX;
  DdHalfWord DVar6;
  uint uVar7;
  uint uVar8;
  undefined6 in_register_00000012;
  ulong uVar9;
  DdHalfWord DVar10;
  undefined4 in_register_00000034;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  lVar11 = CONCAT44(in_register_00000034,label);
  t = (DdTlcInfo *)malloc(0x18);
  if (t != (DdTlcInfo *)0x0) {
    t->vars = (DdHalfWord *)0x0;
    t->phases = (long *)0x0;
    t->cnt = 0;
    lVar2 = 0;
    do {
      lVar3 = lVar2;
      lVar2 = lVar3 + 2;
    } while (*(int *)((long)&Cres->vars + lVar3 * 4 + 4) != 0 ||
             *(int *)((long)&Cres->vars + lVar3 * 4) != 0);
    __ptr = (DdHalfWord *)malloc(lVar3 * 4 + 0x10U & 0x3fffffff8);
    if (__ptr != (DdHalfWord *)0x0) {
      uVar8 = 1;
      plVar4 = (long *)calloc(1,(ulong)((int)lVar3 + 3U >> 3 & 0xffffff8) + 8);
      if (plVar4 != (long *)0x0) {
        t->vars = __ptr;
        t->phases = plVar4;
        DVar6 = *(DdHalfWord *)&Cres->vars;
        DVar10 = *(DdHalfWord *)((long)&Cres->vars + 4);
        if (DVar10 == 0 && DVar6 == 0) {
          uVar9 = 0;
          uVar12 = 0;
          lVar11 = 1;
        }
        else {
          uVar12 = 0;
          do {
            uVar9 = uVar12;
            uVar12 = uVar9 >> 6 & 0x3ffffff;
            uVar8 = (uint)uVar9 & 0x3e;
            __ptr[uVar9] = DVar6;
            __ptr[uVar9 + 1] = DVar10;
            if (lVar11 == 0) {
              uVar13 = 0;
            }
            else {
              uVar13 = (ulong)((*(ulong *)(lVar11 + uVar12 * 8) >> uVar8 & 1) != 0);
            }
            uVar7 = (uint)uVar9 & 0x3e;
            uVar1 = (ulong)uVar7 + 1;
            if (lVar11 == 0) {
              uVar14 = 0;
            }
            else {
              uVar14 = (ulong)((*(ulong *)(lVar11 + uVar12 * 8) >> (uVar1 & 0x3f) & 1) != 0);
            }
            plVar4[uVar12] =
                 uVar14 << ((byte)uVar1 & 0x3f) |
                 ~(2L << (sbyte)uVar7) & (plVar4[uVar12] & ~(1L << uVar8) | uVar13 << (sbyte)uVar8);
            uVar12 = uVar9 + 2;
            DVar6 = *(DdHalfWord *)((long)&Cres->phases + uVar9 * 4);
            DVar10 = *(DdHalfWord *)((long)&Cres->phases + uVar9 * 4 + 4);
          } while (DVar10 != 0 || DVar6 != 0);
          lVar11 = uVar9 + 3;
          uVar8 = (uint)lVar11 & 0x3f;
          uVar9 = uVar12 & 0xffffffff;
        }
        __ptr[uVar12] = (DdHalfWord)CONCAT62(in_register_00000012,phase);
        bVar5 = (byte)uVar9 & 0x3e;
        uVar12 = plVar4[uVar9 >> 6];
        __ptr[lVar11] = 0x7fffffff;
        plVar4[uVar9 >> 6] = (long)in_CX << bVar5 | uVar12 & ~(1L << bVar5) | 1L << uVar8;
        uVar7 = (int)uVar9 + 2;
        (__ptr + uVar9 + 2)[0] = 0;
        (__ptr + uVar9 + 2)[1] = 0;
        uVar8 = (int)uVar9 + 3;
        bVar5 = (byte)uVar7 & 0x3e;
        plVar4[uVar7 >> 6] =
             plVar4[uVar7 >> 6] & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        bVar5 = (byte)uVar8 & 0x3f;
        plVar4[uVar8 >> 6] =
             plVar4[uVar8 >> 6] & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        return t;
      }
      free(__ptr);
    }
    Cudd_tlcInfoFree(t);
  }
  return (DdTlcInfo *)0x0;
}

Assistant:

static DdTlcInfo *
computeClausesWithUniverse(
  DdTlcInfo *Cres /* list of clauses for child */,
  DdHalfWord label /* variable labeling the current node */,
  short phase /* 0 if E child is zero; 1 if T child is zero */)
{
    DdHalfWord *Ccv = Cres->vars; /* variables of clauses for child */
    BitVector *Ccp = Cres->phases; /* phases of clauses for child */
    DdHalfWord *Vcv = NULL; /* pointer to the variables of the clauses for v */
    BitVector *Vcp = NULL; /* pointer to the phases of the clauses for v */
    DdTlcInfo *res = NULL; /* the set of clauses to be returned */
    int i;

    /* Initialize result. */
    res = tlcInfoAlloc();
    if (res == NULL) goto cleanup;
    /* Count entries for new list and allocate accordingly. */
    for (i = 0; !sentinelp(Ccv[i], Ccv[i+1]); i += 2);
    /* At this point, i is twice the number of clauses in the child's
    ** list.  We need four more entries for this node: 2 for the one-literal
    ** clause for the label, and 2 for the sentinel. */
    Vcv = ABC_ALLOC(DdHalfWord,i+4);
    if (Vcv == NULL) goto cleanup;
    Vcp = bitVectorAlloc(i+4);
    if (Vcp == NULL) goto cleanup;
    res->vars = Vcv;
    res->phases = Vcp;
    /* Copy old list into new. */
    for (i = 0; !sentinelp(Ccv[i], Ccv[i+1]); i += 2) {
        Vcv[i] = Ccv[i];
        Vcv[i+1] = Ccv[i+1];
        bitVectorSet(Vcp, i, bitVectorRead(Ccp, i));
        bitVectorSet(Vcp, i+1, bitVectorRead(Ccp, i+1));
    }
    /* Add clause corresponding to label. */
    Vcv[i] = label;
    bitVectorSet(Vcp, i, phase);
    i++;
    Vcv[i] = CUDD_MAXINDEX;
    bitVectorSet(Vcp, i, 1);
    i++;
    /* Add sentinel. */
    Vcv[i] = 0;
    Vcv[i+1] = 0;
    bitVectorSet(Vcp, i, 0);
    bitVectorSet(Vcp, i+1, 0);

    return(res);

 cleanup:
    /* Vcp is guaranteed to be NULL here.  Hence, we do not try to free it. */
    if (Vcv != NULL) ABC_FREE(Vcv);
    if (res != NULL) Cudd_tlcInfoFree(res);

    return(NULL);

}